

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O0

TranslatorInfo * __thiscall
helics::TranslatorFederate::getTranslatorInfo(TranslatorFederate *this,GlobalHandle gid)

{
  TranslatorInfo *pTVar1;
  GlobalHandle *unaff_retaddr;
  
  pTVar1 = gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::find
                     ((MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *)this,
                      unaff_retaddr);
  return pTVar1;
}

Assistant:

TranslatorInfo* TranslatorFederate::getTranslatorInfo(GlobalHandle gid)
{
    return translators.find(gid);
}